

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O2

void __thiscall uInputPlus::uInput::__init(uInput *this,uInputSetup *setup)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  int iVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  system_error *this_01;
  int *piVar6;
  error_category *peVar7;
  pointer puVar8;
  key_type local_3c [3];
  
  iVar3 = open("/dev/uinput",0x801);
  this->fd_ = iVar3;
  if (iVar3 < 0) {
    this_01 = (system_error *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    peVar7 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_01,iVar3,peVar7,"failed to open uinput device");
  }
  else {
    this_00 = &setup->Events;
    p_Var1 = &(setup->Events)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var4 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      iVar3 = ioctl(this->fd_,0x40045564,(ulong)p_Var4[1]._M_color);
      if (iVar3 != 0) {
        this_01 = (system_error *)__cxa_allocate_exception(0x20);
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        peVar7 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_01,iVar3,peVar7,"UI_SET_EVBIT ioctl failed");
        goto LAB_001051f9;
      }
    }
    local_3c[2] = 1;
    cVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&this_00->_M_t,local_3c + 2);
    if ((_Rb_tree_header *)cVar5._M_node != p_Var1) {
      for (p_Var4 = (setup->Keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(setup->Keys)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        iVar3 = ioctl(this->fd_,0x40045565,(ulong)p_Var4[1]._M_color);
        if (iVar3 != 0) {
          this_01 = (system_error *)__cxa_allocate_exception(0x20);
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_01,iVar3,peVar7,"UI_SET_EVBIT ioctl failed");
          goto LAB_001051f9;
        }
      }
    }
    local_3c[1] = 2;
    cVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&this_00->_M_t,local_3c + 1);
    if ((_Rb_tree_header *)cVar5._M_node != p_Var1) {
      for (p_Var4 = (setup->Rels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(setup->Rels)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        iVar3 = ioctl(this->fd_,0x40045566,(ulong)p_Var4[1]._M_color);
        if (iVar3 != 0) {
          this_01 = (system_error *)__cxa_allocate_exception(0x20);
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_01,iVar3,peVar7,"UI_SET_RELBIT ioctl failed");
          goto LAB_001051f9;
        }
      }
    }
    local_3c[0] = 3;
    cVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&this_00->_M_t,local_3c);
    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
LAB_001050a0:
      for (p_Var4 = (setup->Props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(setup->Props)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        iVar3 = ioctl(this->fd_,0x4004556e,(ulong)p_Var4[1]._M_color);
        if (iVar3 != 0) {
          this_01 = (system_error *)__cxa_allocate_exception(0x20);
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_01,iVar3,peVar7,"UI_SET_PROPBIT ioctl failed");
          goto LAB_001051f9;
        }
      }
      iVar3 = ioctl(this->fd_,0x405c5503,setup);
      if (iVar3 == 0) {
        iVar3 = ioctl(this->fd_,0x5501);
        if (iVar3 == 0) {
          return;
        }
        this_01 = (system_error *)__cxa_allocate_exception(0x20);
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        peVar7 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_01,iVar3,peVar7,"UI_DEV_CREATE ioctl failed");
      }
      else {
        this_01 = (system_error *)__cxa_allocate_exception(0x20);
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        peVar7 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_01,iVar3,peVar7,"UI_DEV_SETUP ioctl failed");
      }
    }
    else {
      puVar8 = (setup->AbsSetup).
               super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (setup->AbsSetup).
               super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (puVar8 == puVar2) goto LAB_001050a0;
        iVar3 = ioctl(this->fd_,0x40045567,(ulong)*puVar8->Code);
        if (iVar3 != 0) {
          this_01 = (system_error *)__cxa_allocate_exception(0x20);
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_01,iVar3,peVar7,"UI_SET_ABSBIT ioctl failed");
          goto LAB_001051f9;
        }
        iVar3 = ioctl(this->fd_,0x401c5504,puVar8);
        puVar8 = puVar8 + 1;
      } while (iVar3 == 0);
      this_01 = (system_error *)__cxa_allocate_exception(0x20);
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      peVar7 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_01,iVar3,peVar7,"UI_ABS_SETUP ioctl failed");
    }
  }
LAB_001051f9:
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void uInput::__init(const uInputSetup &setup) {
	fd_ = open("/dev/uinput", O_WRONLY | O_NONBLOCK);

	if (fd_ < 0)
		throw std::system_error(errno, std::system_category(), "failed to open uinput device");

	for (auto it : setup.Events) {
		if (ioctl(fd_, UI_SET_EVBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
	}

	if (setup.Events.find(EV_KEY) != setup.Events.end()) {
		for (auto it : setup.Keys) {
			if (ioctl(fd_, UI_SET_KEYBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
		}
	}

	if (setup.Events.find(EV_REL) != setup.Events.end()) {
		for (auto it : setup.Rels) {
			if (ioctl(fd_, UI_SET_RELBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_RELBIT ioctl failed");
		}
	}


//	uinput_abs_setup s1, s2, s3, s4;
//
//	memset(&s1, 0, sizeof(uinput_abs_setup));
//	memset(&s2, 0, sizeof(uinput_abs_setup));
//	memset(&s3, 0, sizeof(uinput_abs_setup));
//	memset(&s4, 0, sizeof(uinput_abs_setup));
//
//	s1.code = ABS_MT_POSITION_X;
//	s2.code = ABS_MT_POSITION_Y;
//	s3.code = ABS_MT_SLOT;
//	s4.code = ABS_MT_TRACKING_ID;
//
//	s1.absinfo.maximum = s2.absinfo.maximum = 4000;
//	s3.absinfo.maximum = 5;
//	s4.absinfo.maximum = 65535;
//
//	ioctl(FD, UI_ABS_SETUP, &s1);
//	ioctl(FD, UI_ABS_SETUP, &s2);
//	ioctl(FD, UI_ABS_SETUP, &s3);
//	ioctl(FD, UI_ABS_SETUP, &s4);


	if (setup.Events.find(EV_ABS) != setup.Events.end()) {

		for (auto &it : setup.AbsSetup) {
			if (ioctl(fd_, UI_SET_ABSBIT, it.Code))
				throw std::system_error(errno, std::system_category(), "UI_SET_ABSBIT ioctl failed");

			if (ioctl(fd_, UI_ABS_SETUP, &(it.setup)))
				throw std::system_error(errno, std::system_category(), "UI_ABS_SETUP ioctl failed");
		}
	}

	for (auto &it : setup.Props) {
		if (ioctl(fd_, UI_SET_PROPBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_PROPBIT ioctl failed");
	}

	if (ioctl(fd_, UI_DEV_SETUP, &(setup.DeviceInfo.usetup)))
		throw std::system_error(errno, std::system_category(), "UI_DEV_SETUP ioctl failed");

	if (ioctl(fd_, UI_DEV_CREATE))
		throw std::system_error(errno, std::system_category(), "UI_DEV_CREATE ioctl failed");

}